

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surveyor.c
# Opt level: O0

int nn_surveyor_events(nn_sockbase *self)

{
  uint uVar1;
  int iVar2;
  nn_surveyor *in_RDI;
  nn_surveyor *surveyor;
  int rc;
  undefined8 local_20;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  local_20 = in_RDI;
  if (in_RDI == (nn_surveyor *)0x0) {
    local_20 = (nn_surveyor *)0x0;
  }
  uVar1 = nn_xsurveyor_events((nn_sockbase *)
                              CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  iVar2 = nn_surveyor_inprogress(local_20);
  if (iVar2 == 0) {
    uVar1 = uVar1 | 1;
  }
  return uVar1;
}

Assistant:

static int nn_surveyor_events (struct nn_sockbase *self)
{
    int rc;
    struct nn_surveyor *surveyor;

    surveyor = nn_cont (self, struct nn_surveyor, xsurveyor.sockbase);

    /*  Determine the actual readability/writability of the socket. */
    rc = nn_xsurveyor_events (&surveyor->xsurveyor.sockbase);

    /*  If there's no survey going on we'll signal IN to interrupt polling
        when the survey expires. nn_recv() will return -EFSM afterwards. */
    if (!nn_surveyor_inprogress (surveyor))
        rc |= NN_SOCKBASE_EVENT_IN;

    return rc;
}